

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O1

void __thiscall
cmSearchPath::AddPathInternal(cmSearchPath *this,string *path,string *prefix,char *base)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pair<std::_Rb_tree_iterator<cmSearchPath::PathWithPrefix>,_bool> pVar3;
  string collapsedPrefix;
  string collapsedPath;
  PathWithPrefix pathWithPrefix;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  string local_80;
  PathWithPrefix local_60;
  
  if (this->FC != (cmFindCommon *)0x0) {
    cmsys::SystemTools::CollapseFullPath(&local_80,path,base);
    if (local_80._M_string_length != 0) {
      local_98 = 0;
      local_90._M_local_buf[0] = '\0';
      local_a0 = &local_90;
      if (prefix->_M_string_length != 0) {
        cmsys::SystemTools::CollapseFullPath(&local_60.Path,prefix,base);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60.Path._M_dataplus._M_p != &local_60.Path.field_2) {
          operator_delete(local_60.Path._M_dataplus._M_p,
                          local_60.Path.field_2._M_allocated_capacity + 1);
        }
      }
      paVar1 = &local_60.Path.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p == &local_80.field_2) {
        local_60.Path.field_2._8_8_ = local_80.field_2._8_8_;
        local_60.Path._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_60.Path._M_dataplus._M_p = local_80._M_dataplus._M_p;
      }
      local_60.Path.field_2._M_allocated_capacity._1_7_ =
           local_80.field_2._M_allocated_capacity._1_7_;
      local_60.Path.field_2._M_local_buf[0] = local_80.field_2._M_local_buf[0];
      paVar2 = &local_60.Prefix.field_2;
      local_60.Path._M_string_length = local_80._M_string_length;
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      if (local_a0 == &local_90) {
        local_60.Prefix.field_2._8_8_ = local_90._8_8_;
        local_60.Prefix._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_60.Prefix._M_dataplus._M_p = (pointer)local_a0;
      }
      local_60.Prefix.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
      local_60.Prefix.field_2._M_local_buf[0] = local_90._M_local_buf[0];
      local_60.Prefix._M_string_length = local_98;
      local_98 = 0;
      local_90._M_local_buf[0] = '\0';
      local_a0 = &local_90;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      pVar3 = std::
              _Rb_tree<cmSearchPath::PathWithPrefix,cmSearchPath::PathWithPrefix,std::_Identity<cmSearchPath::PathWithPrefix>,std::less<cmSearchPath::PathWithPrefix>,std::allocator<cmSearchPath::PathWithPrefix>>
              ::_M_insert_unique<cmSearchPath::PathWithPrefix_const&>
                        ((_Rb_tree<cmSearchPath::PathWithPrefix,cmSearchPath::PathWithPrefix,std::_Identity<cmSearchPath::PathWithPrefix>,std::less<cmSearchPath::PathWithPrefix>,std::allocator<cmSearchPath::PathWithPrefix>>
                          *)&this->FC->SearchPathsEmitted,&local_60);
      if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>::
        emplace_back<cmSearchPath::PathWithPrefix>(&this->Paths,&local_60);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.Prefix._M_dataplus._M_p != paVar2) {
        operator_delete(local_60.Prefix._M_dataplus._M_p,
                        local_60.Prefix.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.Path._M_dataplus._M_p != paVar1) {
        operator_delete(local_60.Path._M_dataplus._M_p,
                        local_60.Path.field_2._M_allocated_capacity + 1);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,
                                          local_90._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  __assert_fail("this->FC != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSearchPath.cxx"
                ,0xd1,
                "void cmSearchPath::AddPathInternal(const std::string &, const std::string &, const char *)"
               );
}

Assistant:

void cmSearchPath::AddPathInternal(const std::string& path,
                                   const std::string& prefix, const char* base)
{
  assert(this->FC != nullptr);

  std::string collapsedPath = cmSystemTools::CollapseFullPath(path, base);

  if (collapsedPath.empty()) {
    return;
  }

  std::string collapsedPrefix;
  if (!prefix.empty()) {
    collapsedPrefix = cmSystemTools::CollapseFullPath(prefix, base);
  }

  // Insert the path if has not already been emitted.
  PathWithPrefix pathWithPrefix{ std::move(collapsedPath),
                                 std::move(collapsedPrefix) };
  if (this->FC->SearchPathsEmitted.insert(pathWithPrefix).second) {
    this->Paths.emplace_back(std::move(pathWithPrefix));
  }
}